

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datalogDatabase.cpp
# Opt level: O0

void __thiscall
DatalogDatabase::fixed_point
          (DatalogDatabase *this,vector<int,_std::allocator<int>_> *rule_inds,ostream *out)

{
  size_type sVar1;
  reference pvVar2;
  reference ppRVar3;
  ulong local_38;
  size_t k;
  int local_28;
  int nits;
  int lastTuples;
  int ntuples;
  ostream *out_local;
  vector<int,_std::allocator<int>_> *rule_inds_local;
  DatalogDatabase *this_local;
  
  nits = totalTuples(this);
  local_28 = -1;
  while (nits != local_28) {
    local_38 = 0;
    while( true ) {
      sVar1 = std::vector<int,_std::allocator<int>_>::size(rule_inds);
      if (sVar1 <= local_38) break;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](rule_inds,local_38);
      ppRVar3 = std::vector<Rule_*,_std::allocator<Rule_*>_>::operator[](&this->rules,(long)*pvVar2)
      ;
      evaluateRule(this,*ppRVar3,out);
      local_38 = local_38 + 1;
    }
    local_28 = nits;
    nits = totalTuples(this);
  }
  std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void DatalogDatabase::fixed_point(vector<int> rule_inds, ostream &out)
{
  int ntuples = totalTuples();
  int lastTuples = -1;
  int nits = 0;

  while (ntuples != lastTuples)
  {
    for (size_t k = 0; k < rule_inds.size(); k++)
    {
      evaluateRule(rules[rule_inds[k]], out);
    }
    lastTuples = ntuples;
    ntuples = totalTuples();
    nits++;
  }
  out << endl;
}